

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  SuperNewDefaultedArgsExpressionSyntax *pSVar1;
  DeepCloneVisitor visitor;
  Token local_50;
  Token local_40;
  Token local_30;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_50,
                    (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x30),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x40),(BumpAllocator *)__child_stack);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SuperNewDefaultedArgsExpressionSyntax,slang::syntax::NameSyntax&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,(NameSyntax *)args,&local_50,&local_30,
                      &local_40);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SuperNewDefaultedArgsExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SuperNewDefaultedArgsExpressionSyntax>(
        *deepClone<NameSyntax>(*node.scopedNew, alloc),
        node.openParen.deepClone(alloc),
        node.defaultKeyword.deepClone(alloc),
        node.closeParen.deepClone(alloc)
    );
}